

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntUniqify(Vec_Int_t *p)

{
  int local_20;
  int RetValue;
  int k;
  int i;
  Vec_Int_t *p_local;
  
  if (p->nSize < 2) {
    p_local._4_4_ = 0;
  }
  else {
    Vec_IntSort(p,0);
    local_20 = 1;
    for (RetValue = 1; RetValue < p->nSize; RetValue = RetValue + 1) {
      if (p->pArray[RetValue] != p->pArray[RetValue + -1]) {
        p->pArray[local_20] = p->pArray[RetValue];
        local_20 = local_20 + 1;
      }
    }
    p_local._4_4_ = p->nSize - local_20;
    p->nSize = local_20;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Vec_IntUniqify( Vec_Int_t * p )
{
    int i, k, RetValue;
    if ( p->nSize < 2 )
        return 0;
    Vec_IntSort( p, 0 );
    for ( i = k = 1; i < p->nSize; i++ )
        if ( p->pArray[i] != p->pArray[i-1] )
            p->pArray[k++] = p->pArray[i];
    RetValue = p->nSize - k;
    p->nSize = k;
    return RetValue;
}